

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_test_helper.cpp
# Opt level: O1

string * __thiscall
bidfx_public_api::price::pixie::PriceMapEvent::GetPriceString_abi_cxx11_
          (string *__return_storage_ptr__,PriceMapEvent *this)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{",1);
  for (p_Var2 = (this->price_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->price_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=",1);
    poVar1 = (ostream *)bidfx_public_api::price::operator<<(poVar1,(PriceField *)(p_Var2 + 2));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string PriceMapEvent::GetPriceString()
{
    std::stringstream ss;
    ss << "{";
    for (auto it = price_.cbegin(); it != price_.cend(); it++)
    {
        ss << (it->first) << "=" << (it->second) << ", ";
    }
    ss << "}";
    return ss.str();
}